

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_map.h
# Opt level: O2

void __thiscall cppcms::impl::string_pool::string_pool(string_pool *this,size_t page_size)

{
  this->page_size_ = page_size;
  this->pages_ = (page *)0x0;
  this->free_space_ = 0;
  this->data_ = (char *)0x0;
  add_page(this);
  return;
}

Assistant:

string_pool(size_t page_size = 2048) : 
				page_size_(page_size),
				pages_(0),
				free_space_(0),
				data_(0)
			{
				add_page();
			}